

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_branch *s)

{
  Expression *pEVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80 [8];
  string symbol;
  allocator local_49;
  string local_48;
  uint16_t local_26;
  Value_type local_24;
  uint uStack_20;
  uint16_t expression_value;
  Value_type exp_type;
  int offset;
  uint code;
  Inst_branch *s_local;
  Code_generator *this_local;
  
  _offset = s;
  s_local = (Inst_branch *)this;
  ast::Instruction::check_alignment(&s->super_Instruction);
  exp_type = ABSOLUTE;
  switch(_offset->condition) {
  case 0x147:
    exp_type = 0x4000;
    break;
  case 0x148:
    exp_type = 0x4400;
    break;
  case 0x149:
  case 0x14c:
    exp_type = 0x4800;
    break;
  case 0x14a:
  case 0x14b:
    exp_type = 0x4c00;
    break;
  case 0x14d:
    exp_type = 0x5400;
    break;
  case 0x14e:
    exp_type = 0x5000;
    break;
  case 0x14f:
    exp_type = 0x5800;
    break;
  case 0x150:
    exp_type = 0x5c00;
  }
  uStack_20 = 0;
  uVar3 = (*_offset->expression->_vptr_Expression[3])();
  if ((uVar3 & 1) != 0) {
    local_24 = ast::Expression::get_type(_offset->expression);
    if (local_24 == ABSOLUTE) {
      local_26 = ast::Expression::get_value(_offset->expression);
      if ((local_26 & 1) != 0) {
        pEVar1 = _offset->expression;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,"Must be an even value!",&local_49);
        warning_report(&pEVar1->location,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
      uStack_20 = (int)(uint)local_26 >> 1;
    }
    else if (local_24 == LABEL) {
      (*_offset->expression->_vptr_Expression[4])();
      uVar3 = (_offset->super_Instruction).super_Statement.section_index;
      std::__cxx11::string::string((string *)&local_a0,local_80);
      uVar4 = ast::Symbols::get_section(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (uVar3 == uVar4) {
        uVar2 = ast::Expression::get_value(_offset->expression);
        uStack_20 = ((uint)uVar2 - (_offset->super_Instruction).super_Statement.section_offset) - 2;
        if ((uStack_20 & 1) != 0) {
          pEVar1 = _offset->expression;
          uVar5 = std::__cxx11::string::c_str();
          string_printf_abi_cxx11_
                    (&local_c0,"Address of %s = 0x%x, must be even!",uVar5,(ulong)uStack_20);
          warning_report(&pEVar1->location,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        if ((0x3ff < (int)uStack_20) || ((int)uStack_20 < -0x400)) {
          pEVar1 = _offset->expression;
          string_printf_abi_cxx11_
                    (&local_e0,
                     "Interval between PC and target address: %+d (0x%x) - isn\'t codable in %d bit two\'s complement"
                     ,(ulong)uStack_20,(ulong)uStack_20,0xb);
          error_report(&pEVar1->location,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        uStack_20 = (int)uStack_20 >> 1;
      }
      else {
        pEVar1 = _offset->expression;
        uVar5 = std::__cxx11::string::c_str();
        string_printf_abi_cxx11_(&local_100,"Label \"%s\" is defined in another section",uVar5);
        error_report(&pEVar1->location,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      std::__cxx11::string::~string(local_80);
    }
  }
  ast::Sections::write16
            ((_offset->super_Instruction).super_Statement.section_index,
             (_offset->super_Instruction).super_Statement.section_offset,
             (ushort)exp_type | (ushort)uStack_20 & 0x3ff);
  return;
}

Assistant:

void Code_generator::visit(Inst_branch *s)
{
	s->check_alignment();
	auto code = 0U;
	switch (s->condition) {
	case EQ:
		code = BEQ_OPCODE;
		break;
	case NE:
		code = BNE_OPCODE;
		break;
	case CC:
       	case LO:
		code = BCC_OPCODE;
		break;
	case CS:
	case HS:
		code = BCS_OPCODE;
		break;
	case GE:
		code = BGE_OPCODE;
		break;
	case LT:
		code = BLT_OPCODE;
		break;
	case B:
		code = B_OPCODE;
		break;
	case BL:
		code = BL_OPCODE;
		break;
	}
	auto offset = 0;    //  o offset do branch é um valor com sinal
	if (s->expression->evaluate()) {
		auto exp_type = s->expression->get_type();
		if (exp_type == ABSOLUTE) {
			auto expression_value = s->expression->get_value();
			if ((expression_value & 1) != 0)
				warning_report(&s->expression->location, "Must be an even value!");
			offset = expression_value >> 1;
		}
		else if (exp_type == Value_type::LABEL) {
			string symbol = s->expression->get_symbol();
			if (s->section_index == Symbols::get_section(symbol)) { //  Label resolvida se pertencer à mesma secção
				offset = s->expression->get_value() - s->section_offset - 2;    //  O PC está dois endereços à frente
				if ((offset & 1) != 0)
					warning_report(&s->expression->location,
						string_printf("Address of %s = 0x%x, must be even!", symbol.c_str(), offset));
				if (offset >= (1 << BRANCH_OFFSET_SIZE) || offset < (~0 << BRANCH_OFFSET_SIZE))
					error_report(&s->expression->location,
						string_printf("Interval between PC and target address: %+d (0x%x) - "
								"isn't codable in %d bit two's complement",
								offset, offset, BRANCH_OFFSET_SIZE + 1));
				offset >>= 1;
			} else {    // A Label pertence a outra secção. Será resolvida na fase de relocalização
				error_report(&s->expression->location,
					string_printf( "Label \"%s\" is defined in another section", symbol.c_str()));
			}
		}
	}
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(code | ((offset & MAKE_MASK(BRANCH_OFFSET_SIZE, 0)) << BRANCH_OFFSET_POSITION)));
}